

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_mov_reg_v(DisasContext *s,MemOp ot,int reg,TCGv_i64 t0)

{
  TCGContext *tcg_ctx;
  TCGv_i64 ret;
  uint uStack_8;
  
  if (MO_64 < ot) {
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
            ,0x1e7);
    abort();
  }
  tcg_ctx = s->uc->tcg_ctx;
  switch(ot) {
  case MO_8:
    if ((0xfffffffb < reg - 8U) && (s->x86_64_hregs != true)) {
      tcg_gen_deposit_i64_x86_64
                (tcg_ctx,tcg_ctx->cpu_regs[reg - 4],tcg_ctx->cpu_regs[reg - 4],t0,8,8);
      return;
    }
    ret = tcg_ctx->cpu_regs[reg];
    uStack_8 = 8;
    break;
  case MO_16:
    ret = tcg_ctx->cpu_regs[reg];
    uStack_8 = 0x10;
    break;
  case MO_32:
    tcg_gen_ext32u_i64_x86_64(tcg_ctx,tcg_ctx->cpu_regs[reg],t0);
    return;
  case MO_64:
    tcg_gen_mov_i64_x86_64(tcg_ctx,tcg_ctx->cpu_regs[reg],t0);
    return;
  }
  tcg_gen_deposit_i64_x86_64(tcg_ctx,ret,ret,t0,0,uStack_8);
  return;
}

Assistant:

static void gen_op_mov_reg_v(DisasContext *s, MemOp ot, int reg, TCGv t0)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    switch(ot) {
    case MO_8:
        if (!byte_reg_is_xH(s, reg)) {
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], tcg_ctx->cpu_regs[reg], t0, 0, 8);
        } else {
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg - 4], tcg_ctx->cpu_regs[reg - 4], t0, 8, 8);
        }
        break;
    case MO_16:
        tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], tcg_ctx->cpu_regs[reg], t0, 0, 16);
        break;
    case MO_32:
        /* For x86_64, this sets the higher half of register to zero.
           For i386, this is equivalent to a mov. */
        tcg_gen_ext32u_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], t0);
        break;
#ifdef TARGET_X86_64
    case MO_64:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], t0);
        break;
#endif
    default:
        tcg_abort();
    }
}